

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_optimizer.hpp
# Opt level: O1

AST_Node_Impl_Ptr<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> __thiscall
chaiscript::optimizer::Return::
optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
          (Return *this,
          AST_Node_Impl_Ptr<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *p)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  long *plVar5;
  long *in_RDX;
  
  lVar1 = *in_RDX;
  if ((((*(int *)(lVar1 + 8) == 0xc) || (*(int *)(lVar1 + 8) == 9)) &&
      (*(long *)(lVar1 + 0x50) != *(long *)(lVar1 + 0x58))) &&
     (lVar1 = *(long *)(*(long *)(lVar1 + 0x58) + -8), *(int *)(lVar1 + 8) == 10)) {
    lVar1 = *(long *)(lVar1 + 0x58);
    lVar2 = *(long *)(lVar1 + -8);
    if ((*(int *)(lVar2 + 8) == 0x13) &&
       (puVar3 = *(undefined8 **)(lVar2 + 0x50), *(long *)(lVar2 + 0x58) - (long)puVar3 == 8)) {
      uVar4 = *puVar3;
      *puVar3 = 0;
      plVar5 = *(long **)(lVar1 + -8);
      *(undefined8 *)(lVar1 + -8) = uVar4;
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 0x18))();
      }
    }
  }
  *(long *)this = *in_RDX;
  *in_RDX = 0;
  return (__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
          )(__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
            )this;
}

Assistant:

auto optimize(eval::AST_Node_Impl_Ptr<T> p) {
        if ((p->identifier == AST_Node_Type::Def || p->identifier == AST_Node_Type::Lambda) && !p->children.empty()) {
          auto &last_child = p->children.back();
          if (last_child->identifier == AST_Node_Type::Block) {
            auto &block_last_child = last_child->children.back();
            if (block_last_child->identifier == AST_Node_Type::Return) {
              if (block_last_child->children.size() == 1) {
                last_child->children.back() = std::move(block_last_child->children[0]);
              }
            }
          }
        }

        return p;
      }